

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

void lj_dispatch_init(GG_State *GG)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  
  lVar3 = 0;
  do {
    uVar1 = *(ushort *)((long)lj_bc_ofs + lVar3);
    *(code **)((long)GG->dispatch + lVar3 * 4) = lj_BC_ISLT + uVar1;
    *(code **)((long)GG->dispatch + lVar3 * 4 + 0x4d0) = lj_BC_ISLT + uVar1;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0xb2);
  lVar3 = 0;
  do {
    GG->dispatch[lVar3 + 0x59] = lj_BC_ISLT + lj_bc_ofs[lVar3 + 0x59];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x41);
  GG->dispatch[0x4f] = GG->dispatch[0x50];
  GG->dispatch[0x52] = GG->dispatch[0x53];
  GG->dispatch[0x55] = GG->dispatch[0x56];
  GG->dispatch[0x59] = GG->dispatch[0x5a];
  GG->dispatch[0x5c] = GG->dispatch[0x5d];
  (GG->g).bc_cfunc_int = 0x145f;
  auVar2 = _DAT_0015d640;
  (GG->g).bc_cfunc_ext = 0x145f;
  lVar3 = 0;
  auVar4 = _DAT_0015d630;
  do {
    if (SUB164(auVar4 ^ auVar2,4) == -0x80000000 && SUB164(auVar4 ^ auVar2,0) < -0x7fffffc7) {
      GG->bcff[lVar3] = (int)lVar3 + 0x61;
      GG->bcff[lVar3 + 1] = (int)lVar3 + 0x62;
    }
    lVar3 = lVar3 + 2;
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
  } while (lVar3 != 0x3a);
  return;
}

Assistant:

void lj_dispatch_init(GG_State *GG)
{
  uint32_t i;
  ASMFunction *disp = GG->dispatch;
  for (i = 0; i < GG_LEN_SDISP; i++)
    disp[GG_LEN_DDISP+i] = disp[i] = makeasmfunc(lj_bc_ofs[i]);
  for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
    disp[i] = makeasmfunc(lj_bc_ofs[i]);
  /* The JIT engine is off by default. luaopen_jit() turns it on. */
  disp[BC_FORL] = disp[BC_IFORL];
  disp[BC_ITERL] = disp[BC_IITERL];
  disp[BC_LOOP] = disp[BC_ILOOP];
  disp[BC_FUNCF] = disp[BC_IFUNCF];
  disp[BC_FUNCV] = disp[BC_IFUNCV];
  GG->g.bc_cfunc_ext = GG->g.bc_cfunc_int = BCINS_AD(BC_FUNCC, LUA_MINSTACK, 0);
  for (i = 0; i < GG_NUM_ASMFF; i++)
    GG->bcff[i] = BCINS_AD(BC__MAX+i, 0, 0);
#if LJ_TARGET_MIPS
  memcpy(GG->got, dispatch_got, LJ_GOT__MAX*sizeof(ASMFunction *));
#endif
}